

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool __thiscall
cmDependsFortran::WriteDependenciesReal
          (cmDependsFortran *this,string *obj,cmFortranSourceInfo *info,string *mod_dir,
          string *stamp_dir,ostream *makeDepends,ostream *internalDepends)

{
  cmLocalGenerator *pcVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  ulong uVar5;
  pointer ppVar6;
  reference __x;
  cmMakefile *this_00;
  char *pcVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  string local_3a8;
  string local_388;
  undefined1 local_368 [8];
  string driver;
  string local_340;
  char *local_320;
  char *cid;
  cmMakefile *mf;
  string stampFileForMake;
  string stampFileForShell;
  undefined1 local_2b0 [8];
  string stampFile_1;
  string local_270;
  undefined1 local_250 [8];
  string modFile;
  string *i_2;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_1e0;
  undefined1 local_1c0 [8];
  string module;
  undefined1 local_180 [8];
  string stampFile;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  iterator local_150;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  const_iterator required;
  _Self local_138;
  reference local_130;
  string *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string local_f0;
  reference local_d0;
  string *i;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string obj_m;
  undefined1 local_80 [8];
  string obj_i;
  string binDir;
  string *src;
  ostream *makeDepends_local;
  string *stamp_dir_local;
  string *mod_dir_local;
  cmFortranSourceInfo *info_local;
  string *obj_local;
  cmDependsFortran *this_local;
  
  psVar3 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((this->super_cmDepends).LocalGenerator);
  std::__cxx11::string::string((string *)(obj_i.field_2._M_local_buf + 8),(string *)psVar3);
  MaybeConvertToRelativePath((string *)local_80,this,(string *)(obj_i.field_2._M_local_buf + 8),obj)
  ;
  cmSystemTools::ConvertToOutputPath((string *)&__range1,(string *)local_80);
  poVar4 = std::operator<<(internalDepends,(string *)local_80);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(internalDepends," ");
  poVar4 = std::operator<<(poVar4,(string *)info);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&info->Includes);
  i = (string *)
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&info->Includes);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&i), bVar2) {
    local_d0 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
    poVar4 = std::operator<<(makeDepends,(string *)&__range1);
    poVar4 = std::operator<<(poVar4,": ");
    MaybeConvertToRelativePath
              ((string *)&__range1_1,this,(string *)((long)&obj_i.field_2 + 8),local_d0);
    cmSystemTools::ConvertToOutputPath(&local_f0,(string *)&__range1_1);
    poVar4 = std::operator<<(poVar4,(string *)&local_f0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&__range1_1);
    poVar4 = std::operator<<(internalDepends," ");
    poVar4 = std::operator<<(poVar4,(string *)local_d0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::ostream::operator<<(makeDepends,std::endl<char,std::char_traits<char>>);
  __end1_1 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&info->Requires);
  i_1 = (string *)
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&info->Requires);
  do {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&i_1);
    if (!bVar2) {
      bVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&info->Provides);
      if (!bVar2) {
        __end2 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&info->Provides);
        i_2 = (string *)
              std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&info->Provides);
        while (bVar2 = std::operator!=(&__end2,(_Self *)&i_2), bVar2) {
          __x = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end2);
          pVar8 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert(&this->Internal->TargetProvides,__x);
          modFile.field_2._8_8_ = pVar8.first._M_node;
          std::__cxx11::string::string((string *)local_250,(string *)mod_dir);
          std::__cxx11::string::operator+=((string *)local_250,"/");
          std::__cxx11::string::operator+=((string *)local_250,(string *)__x);
          pcVar1 = (this->super_cmDepends).LocalGenerator;
          MaybeConvertToRelativePath
                    ((string *)((long)&stampFile_1.field_2 + 8),this,
                     (string *)((long)&obj_i.field_2 + 8),(string *)local_250);
          cmOutputConverter::ConvertToOutputFormat
                    (&local_270,&pcVar1->super_cmOutputConverter,
                     (string *)((long)&stampFile_1.field_2 + 8),SHELL);
          std::__cxx11::string::operator=((string *)local_250,(string *)&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)(stampFile_1.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_2b0,(string *)stamp_dir);
          std::__cxx11::string::operator+=((string *)local_2b0,"/");
          std::__cxx11::string::operator+=((string *)local_2b0,(string *)__x);
          std::__cxx11::string::operator+=((string *)local_2b0,".stamp");
          MaybeConvertToRelativePath
                    ((string *)((long)&stampFileForShell.field_2 + 8),this,
                     (string *)((long)&obj_i.field_2 + 8),(string *)local_2b0);
          std::__cxx11::string::operator=
                    ((string *)local_2b0,(string *)(stampFileForShell.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(stampFileForShell.field_2._M_local_buf + 8));
          cmOutputConverter::ConvertToOutputFormat
                    ((string *)((long)&stampFileForMake.field_2 + 8),
                     &((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                     (string *)local_2b0,SHELL);
          cmSystemTools::ConvertToOutputPath((string *)&mf,(string *)local_2b0);
          poVar4 = std::operator<<(makeDepends,(string *)&__range1);
          poVar4 = std::operator<<(poVar4,".provides.build");
          poVar4 = std::operator<<(poVar4,": ");
          poVar4 = std::operator<<(poVar4,(string *)&mf);
          std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(makeDepends,(string *)&mf);
          poVar4 = std::operator<<(poVar4,": ");
          poVar4 = std::operator<<(poVar4,(string *)&__range1);
          std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(makeDepends,"\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod ");
          poVar4 = std::operator<<(poVar4,(string *)local_250);
          poVar4 = std::operator<<(poVar4," ");
          std::operator<<(poVar4,(string *)(stampFileForMake.field_2._M_local_buf + 8));
          this_00 = cmLocalGenerator::GetMakefile((this->super_cmDepends).LocalGenerator);
          cid = (char *)this_00;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_340,"CMAKE_Fortran_COMPILER_ID",
                     (allocator<char> *)(driver.field_2._M_local_buf + 0xf));
          pcVar7 = cmMakefile::GetDefinition(this_00,&local_340);
          std::__cxx11::string::~string((string *)&local_340);
          std::allocator<char>::~allocator((allocator<char> *)(driver.field_2._M_local_buf + 0xf));
          local_320 = pcVar7;
          if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
            poVar4 = std::operator<<(makeDepends," ");
            std::operator<<(poVar4,local_320);
          }
          std::operator<<(makeDepends,"\n");
          std::__cxx11::string::~string((string *)&mf);
          std::__cxx11::string::~string((string *)(stampFileForMake.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_2b0);
          std::__cxx11::string::~string((string *)local_250);
          std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end2);
        }
        poVar4 = std::operator<<(makeDepends,(string *)&__range1);
        std::operator<<(poVar4,".provides.build:\n");
        poVar4 = std::operator<<(makeDepends,"\t$(CMAKE_COMMAND) -E touch ");
        poVar4 = std::operator<<(poVar4,(string *)&__range1);
        std::operator<<(poVar4,".provides.build\n");
        std::__cxx11::string::string
                  ((string *)local_368,(string *)&(this->super_cmDepends).TargetDirectory);
        std::__cxx11::string::operator+=((string *)local_368,"/build");
        MaybeConvertToRelativePath
                  (&local_3a8,this,(string *)((long)&obj_i.field_2 + 8),(string *)local_368);
        cmSystemTools::ConvertToOutputPath(&local_388,&local_3a8);
        std::__cxx11::string::operator=((string *)local_368,(string *)&local_388);
        std::__cxx11::string::~string((string *)&local_388);
        std::__cxx11::string::~string((string *)&local_3a8);
        poVar4 = std::operator<<(makeDepends,(string *)local_368);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,(string *)&__range1);
        std::operator<<(poVar4,".provides.build\n");
        std::__cxx11::string::~string((string *)local_368);
      }
      std::__cxx11::string::~string((string *)&__range1);
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)(obj_i.field_2._M_local_buf + 8));
      return true;
    }
    local_130 = std::
                _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&__end1_1);
    local_138._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&info->Provides,local_130);
    required._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::cend(&info->Provides);
    bVar2 = std::operator!=(&local_138,(_Self *)&required);
    if (!bVar2) {
      local_150._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->Internal->TargetRequires,local_130);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_148,&local_150);
      stampFile.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->Internal->TargetRequires);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree_const_iterator(&local_158,(iterator *)((long)&stampFile.field_2 + 8));
      bVar2 = std::operator==(&local_148,&local_158);
      if (bVar2) {
        abort();
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator->(&local_148);
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        ppVar6 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_148);
        MaybeConvertToRelativePath
                  ((string *)((long)&module.field_2 + 8),this,(string *)((long)&obj_i.field_2 + 8),
                   &ppVar6->second);
        cmSystemTools::ConvertToOutputPath
                  ((string *)local_180,(string *)((long)&module.field_2 + 8));
        std::__cxx11::string::~string((string *)(module.field_2._M_local_buf + 8));
        poVar4 = std::operator<<(makeDepends,(string *)&__range1);
        poVar4 = std::operator<<(poVar4,": ");
        poVar4 = std::operator<<(poVar4,(string *)local_180);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)local_180);
      }
      else {
        std::__cxx11::string::string((string *)local_1c0);
        bVar2 = FindModule(this,local_130,(string *)local_1c0);
        if (bVar2) {
          MaybeConvertToRelativePath
                    ((string *)&__range2,this,(string *)((long)&obj_i.field_2 + 8),
                     (string *)local_1c0);
          cmSystemTools::ConvertToOutputPath(&local_1e0,(string *)&__range2);
          std::__cxx11::string::operator=((string *)local_1c0,(string *)&local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::__cxx11::string::~string((string *)&__range2);
          poVar4 = std::operator<<(makeDepends,(string *)&__range1);
          poVar4 = std::operator<<(poVar4,": ");
          poVar4 = std::operator<<(poVar4,(string *)local_1c0);
          std::operator<<(poVar4,"\n");
        }
        std::__cxx11::string::~string((string *)local_1c0);
      }
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

bool cmDependsFortran::WriteDependenciesReal(std::string const& obj,
                                             cmFortranSourceInfo const& info,
                                             std::string const& mod_dir,
                                             std::string const& stamp_dir,
                                             std::ostream& makeDepends,
                                             std::ostream& internalDepends)
{
  typedef cmDependsFortranInternals::TargetRequiresMap TargetRequiresMap;

  // Get the source file for this object.
  std::string const& src = info.Source;

  // Write the include dependencies to the output stream.
  std::string binDir = this->LocalGenerator->GetBinaryDirectory();
  std::string obj_i = this->MaybeConvertToRelativePath(binDir, obj);
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i);
  internalDepends << obj_i << std::endl;
  internalDepends << " " << src << std::endl;
  for (std::string const& i : info.Includes) {
    makeDepends << obj_m << ": "
                << cmSystemTools::ConvertToOutputPath(
                     this->MaybeConvertToRelativePath(binDir, i))
                << std::endl;
    internalDepends << " " << i << std::endl;
  }
  makeDepends << std::endl;

  // Write module requirements to the output stream.
  for (std::string const& i : info.Requires) {
    // Require only modules not provided in the same source.
    if (info.Provides.find(i) != info.Provides.cend()) {
      continue;
    }

    // The object file should depend on timestamped files for the
    // modules it uses.
    TargetRequiresMap::const_iterator required =
      this->Internal->TargetRequires.find(i);
    if (required == this->Internal->TargetRequires.end()) {
      abort();
    }
    if (!required->second.empty()) {
      // This module is known.  Depend on its timestamp file.
      std::string stampFile = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, required->second));
      makeDepends << obj_m << ": " << stampFile << "\n";
    } else {
      // This module is not known to CMake.  Try to locate it where
      // the compiler will and depend on that.
      std::string module;
      if (this->FindModule(i, module)) {
        module = cmSystemTools::ConvertToOutputPath(
          this->MaybeConvertToRelativePath(binDir, module));
        makeDepends << obj_m << ": " << module << "\n";
      }
    }
  }

  // If any modules are provided then they must be converted to stamp files.
  if (!info.Provides.empty()) {
    // Create a target to copy the module after the object file
    // changes.
    for (std::string const& i : info.Provides) {
      // Include this module in the set provided by this target.
      this->Internal->TargetProvides.insert(i);

      // Always use lower case for the mod stamp file name.  The
      // cmake_copy_f90_mod will call back to this class, which will
      // try various cases for the real mod file name.
      std::string modFile = mod_dir;
      modFile += "/";
      modFile += i;
      modFile = this->LocalGenerator->ConvertToOutputFormat(
        this->MaybeConvertToRelativePath(binDir, modFile),
        cmOutputConverter::SHELL);
      std::string stampFile = stamp_dir;
      stampFile += "/";
      stampFile += i;
      stampFile += ".stamp";
      stampFile = this->MaybeConvertToRelativePath(binDir, stampFile);
      std::string const stampFileForShell =
        this->LocalGenerator->ConvertToOutputFormat(stampFile,
                                                    cmOutputConverter::SHELL);
      std::string const stampFileForMake =
        cmSystemTools::ConvertToOutputPath(stampFile);

      makeDepends << obj_m << ".provides.build"
                  << ": " << stampFileForMake << "\n";
      // Note that when cmake_copy_f90_mod finds that a module file
      // and the corresponding stamp file have no differences, the stamp
      // file is not updated. In such case the stamp file will be always
      // older than its prerequisite and trigger cmake_copy_f90_mod
      // on each new build. This is expected behavior for incremental
      // builds and can not be changed without preforming recursive make
      // calls that would considerably slow down the building process.
      makeDepends << stampFileForMake << ": " << obj_m << "\n";
      makeDepends << "\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod " << modFile
                  << " " << stampFileForShell;
      cmMakefile* mf = this->LocalGenerator->GetMakefile();
      const char* cid = mf->GetDefinition("CMAKE_Fortran_COMPILER_ID");
      if (cid && *cid) {
        makeDepends << " " << cid;
      }
      makeDepends << "\n";
    }
    makeDepends << obj_m << ".provides.build:\n";
    // After copying the modules update the timestamp file.
    makeDepends << "\t$(CMAKE_COMMAND) -E touch " << obj_m
                << ".provides.build\n";

    // Make sure the module timestamp rule is evaluated by the time
    // the target finishes building.
    std::string driver = this->TargetDirectory;
    driver += "/build";
    driver = cmSystemTools::ConvertToOutputPath(
      this->MaybeConvertToRelativePath(binDir, driver));
    makeDepends << driver << ": " << obj_m << ".provides.build\n";
  }

  return true;
}